

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<ZCC_StructWork_*,_ZCC_StructWork_*>::DoCopy
          (TArray<ZCC_StructWork_*,_ZCC_StructWork_*> *this,
          TArray<ZCC_StructWork_*,_ZCC_StructWork_*> *other)

{
  uint uVar1;
  ZCC_StructWork **ppZVar2;
  ulong uVar3;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (ZCC_StructWork **)0x0;
  }
  else {
    ppZVar2 = (ZCC_StructWork **)
              M_Malloc_Dbg((ulong)uVar1 << 3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                           ,0x199);
    this->Array = ppZVar2;
    uVar1 = this->Count;
    if ((ulong)uVar1 != 0) {
      uVar3 = 0;
      do {
        this->Array[uVar3] = other->Array[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}